

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturing.hpp
# Opt level: O1

Vector3<double> *
eos::render::detail::tex2d_linear<double>
          (Vector3<double> *__return_storage_ptr__,Vector2<double> *imageTexCoord,uchar mipmap_index
          ,Texture *texture)

{
  pointer pIVar1;
  long lVar2;
  Pixel<unsigned_char,_4> *pPVar3;
  int iVar4;
  undefined7 in_register_00000011;
  int y;
  int iVar5;
  int x;
  int iVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  dVar8 = (imageTexCoord->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
          m_data.array[0];
  dVar9 = (imageTexCoord->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
          m_data.array[1];
  x = (int)dVar8;
  iVar6 = (int)dVar9;
  fVar12 = (float)(dVar8 - (double)(int)dVar8);
  fVar7 = (float)(dVar9 - (double)(int)dVar9);
  fVar14 = (1.0 - fVar12) * (1.0 - fVar7);
  fVar13 = (1.0 - fVar7) * fVar12;
  fVar11 = (1.0 - fVar12) * fVar7;
  pIVar1 = (texture->mipmaps).
           super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (ulong)(uint)((int)CONCAT71(in_register_00000011,mipmap_index) << 3) * 5;
  iVar5 = x;
  if (*(int *)((long)&pIVar1->width_ + lVar2) == x) {
    iVar5 = 0;
  }
  iVar4 = iVar6;
  if (*(int *)((long)&pIVar1->height_ + lVar2) == iVar6) {
    iVar4 = 0;
  }
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)((long)&pIVar1->height_ + lVar2)
                      ,iVar4,iVar5);
  dVar8 = (double)((float)(pPVar3->data_)._M_elems[0] * fVar14);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = dVar8;
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                      ((long)&((texture->mipmaps).
                               super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar2),iVar4,
                      iVar5);
  dVar9 = (double)((float)(pPVar3->data_)._M_elems[1] * fVar14);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] = dVar9;
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                      ((long)&((texture->mipmaps).
                               super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar2),iVar4,
                      iVar5);
  dVar10 = (double)((float)(pPVar3->data_)._M_elems[2] * fVar14);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = dVar10;
  iVar4 = x + 1;
  pIVar1 = (texture->mipmaps).
           super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar5 = iVar4;
  if (iVar4 == *(int *)((long)&pIVar1->width_ + lVar2)) {
    iVar5 = 0;
  }
  y = iVar6;
  if (*(int *)((long)&pIVar1->height_ + lVar2) == iVar6) {
    y = 0;
  }
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)((long)&pIVar1->height_ + lVar2)
                      ,y,iVar5);
  dVar8 = (double)((float)(pPVar3->data_)._M_elems[0] * fVar13) + dVar8;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = dVar8;
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                      ((long)&((texture->mipmaps).
                               super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar2),y,iVar5)
  ;
  dVar9 = (double)((float)(pPVar3->data_)._M_elems[1] * fVar13) + dVar9;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] = dVar9;
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                      ((long)&((texture->mipmaps).
                               super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar2),y,iVar5)
  ;
  dVar10 = (double)((float)(pPVar3->data_)._M_elems[2] * fVar13) + dVar10;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = dVar10;
  pIVar1 = (texture->mipmaps).
           super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(int *)((long)&pIVar1->width_ + lVar2) == x) {
    x = 0;
  }
  iVar6 = iVar6 + 1;
  iVar5 = iVar6;
  if (iVar6 == *(int *)((long)&pIVar1->height_ + lVar2)) {
    iVar5 = 0;
  }
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)((long)&pIVar1->height_ + lVar2)
                      ,iVar5,x);
  dVar8 = (double)((float)(pPVar3->data_)._M_elems[0] * fVar11) + dVar8;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = dVar8;
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                      ((long)&((texture->mipmaps).
                               super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar2),iVar5,x)
  ;
  dVar9 = (double)((float)(pPVar3->data_)._M_elems[1] * fVar11) + dVar9;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] = dVar9;
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                      ((long)&((texture->mipmaps).
                               super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar2),iVar5,x)
  ;
  dVar10 = (double)((float)(pPVar3->data_)._M_elems[2] * fVar11) + dVar10;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = dVar10;
  pIVar1 = (texture->mipmaps).
           super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (iVar4 == *(int *)((long)&pIVar1->width_ + lVar2)) {
    iVar4 = 0;
  }
  if (iVar6 == *(int *)((long)&pIVar1->height_ + lVar2)) {
    iVar6 = 0;
  }
  fVar12 = fVar12 * fVar7;
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)((long)&pIVar1->height_ + lVar2)
                      ,iVar6,iVar4);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = (double)((float)(pPVar3->data_)._M_elems[0] * fVar12) + dVar8;
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                      ((long)&((texture->mipmaps).
                               super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar2),iVar6,
                      iVar4);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] = (double)((float)(pPVar3->data_)._M_elems[1] * fVar12) + dVar9;
  pPVar3 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                     ((Image<eos::core::Pixel<unsigned_char,_4>_> *)
                      ((long)&((texture->mipmaps).
                               super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->height_ + lVar2),iVar6,
                      iVar4);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = (double)((float)(pPVar3->data_)._M_elems[2] * fVar12) + dVar10;
  return __return_storage_ptr__;
}

Assistant:

inline Eigen::Vector3<T> tex2d_linear(const Eigen::Vector2<T>& imageTexCoord, unsigned char mipmap_index,
                                      const Texture& texture)
{
    const int x = (int)imageTexCoord[0];
    const int y = (int)imageTexCoord[1];
    const float alpha = imageTexCoord[0] - x;
    const float beta = imageTexCoord[1] - y;
    const float oneMinusAlpha = 1.0f - alpha;
    const float oneMinusBeta = 1.0f - beta;
    const float a = oneMinusAlpha * oneMinusBeta;
    const float b = alpha * oneMinusBeta;
    const float c = oneMinusAlpha * beta;
    const float d = alpha * beta;
    Eigen::Vector3<T> color;

    // int pixelIndex;
    // pixelIndex = getPixelIndex_wrap(x, y, texture->mipmaps[mipmapIndex].cols,
    // texture->mipmaps[mipmapIndex].rows);
    int pixelIndexCol = x;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    int pixelIndexRow = y;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    // std::cout << texture.mipmaps[mipmapIndex].cols << " " << texture.mipmaps[mipmapIndex].rows << " " <<
    // texture.mipmaps[mipmapIndex].channels() << std::endl;  cv::imwrite("mm.png",
    // texture.mipmaps[mipmapIndex]);
    color[0] = a * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] = a * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] = a * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    // pixelIndex = getPixelIndex_wrap(x + 1, y, texture.mipmaps[mipmapIndex].cols,
    // texture.mipmaps[mipmapIndex].rows);
    pixelIndexCol = x + 1;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    pixelIndexRow = y;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    color[0] += b * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] += b * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] += b * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    // pixelIndex = getPixelIndex_wrap(x, y + 1, texture.mipmaps[mipmapIndex].cols,
    // texture.mipmaps[mipmapIndex].rows);
    pixelIndexCol = x;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    pixelIndexRow = y + 1;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    color[0] += c * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] += c * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] += c * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    // pixelIndex = getPixelIndex_wrap(x + 1, y + 1, texture.mipmaps[mipmapIndex].cols,
    // texture.mipmaps[mipmapIndex].rows);
    pixelIndexCol = x + 1;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    pixelIndexRow = y + 1;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    color[0] += d * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] += d * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] += d * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    return color;
}